

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triangle.h
# Opt level: O0

void __thiscall
Triangle::Triangle(Triangle *this,float x_,float y_,float z_,float width_,float height_,
                  float windowScale_,float scale_)

{
  float scale__local;
  float windowScale__local;
  float height__local;
  float width__local;
  float z__local;
  float y__local;
  float x__local;
  Triangle *this_local;
  
  this->x = 0.0;
  this->y = 0.0;
  this->z = 0.0;
  this->width = 0.0;
  this->height = 0.0;
  this->windowScale = 1.0;
  this->rotationX = 0.0;
  this->rotationY = 0.0;
  this->scale = 1.0;
  this->x = x_;
  this->y = y_;
  this->z = z_;
  this->width = width_;
  this->height = height_;
  this->windowScale = windowScale_;
  this->scale = scale_;
  return;
}

Assistant:

Triangle(float x_, float y_, float z_, float width_, float height_, float windowScale_, float scale_ = 1.0) {
        x = x_; y = y_; z = z_; width = width_; height = height_, windowScale = windowScale_; scale = scale_;
    }